

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

void tcg_register_jit_riscv32(TCGContext_conflict9 *s,void *buf,size_t buf_size)

{
  size_t buf_size_local;
  void *buf_local;
  TCGContext_conflict9 *s_local;
  
  tcg_register_jit_int(s,buf,buf_size,&debug_frame,0x3a);
  return;
}

Assistant:

void tcg_register_jit(TCGContext *s, void *buf, size_t buf_size)
{
    tcg_register_jit_int(s, buf, buf_size, &debug_frame, sizeof(debug_frame));
}